

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O0

XIncludeHistoryNode * __thiscall
xercesc_4_0::XIncludeUtils::popFromCurrentInclusionHistoryStack(XIncludeUtils *this,XMLCh *param_1)

{
  XIncludeHistoryNode *local_30;
  XIncludeHistoryNode *penultimateCursor;
  XIncludeHistoryNode *historyCursor;
  XMLCh *param_1_local;
  XIncludeUtils *this_local;
  
  local_30 = this->fIncludeHistoryHead;
  penultimateCursor = local_30;
  if (this->fIncludeHistoryHead != (XIncludeHistoryNode *)0x0) {
    for (; penultimateCursor->next != (XIncludeHistoryNode *)0x0;
        penultimateCursor = penultimateCursor->next) {
      local_30 = penultimateCursor;
    }
    if (penultimateCursor == this->fIncludeHistoryHead) {
      this->fIncludeHistoryHead = (XIncludeHistoryNode *)0x0;
    }
    else {
      local_30->next = (XIncludeHistoryNode *)0x0;
    }
    XMLString::release(&penultimateCursor->URI,XMLPlatformUtils::fgMemoryManager);
    (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[4])
              (XMLPlatformUtils::fgMemoryManager,penultimateCursor);
  }
  return (XIncludeHistoryNode *)0x0;
}

Assistant:

XIncludeHistoryNode *
XIncludeUtils::popFromCurrentInclusionHistoryStack(const XMLCh * /*toPop*/){
    XIncludeHistoryNode *historyCursor = fIncludeHistoryHead;
    XIncludeHistoryNode *penultimateCursor = historyCursor;

    if (fIncludeHistoryHead == NULL){
        return NULL;
    }

    while (historyCursor->next != NULL){
        penultimateCursor = historyCursor;
        historyCursor = historyCursor->next;
    }

    if (historyCursor == fIncludeHistoryHead){
        fIncludeHistoryHead = NULL;
    } else {
        penultimateCursor->next = NULL;
    }

    XMLString::release(&(historyCursor->URI));
    XMLPlatformUtils::fgMemoryManager->deallocate((void *)historyCursor);
    return NULL;
}